

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoMeEdgeCalculator.cpp
# Opt level: O2

bool __thiscall
NoMeEdgeCalculator::scoreReads
          (NoMeEdgeCalculator *this,AlignmentRecord *ap1,AlignmentRecord *ap2,bool isClique,
          int numGCAllowedPos,int ct)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  pair<int,_int> pVar13;
  AlignmentRecord *this_00;
  string *psVar14;
  double dVar15;
  int in_stack_fffffffffffff1c8;
  double local_e28;
  double local_e20;
  string *local_e08;
  string *local_e00;
  string *local_df8;
  string local_df0;
  string local_dd0;
  string local_db0;
  string local_d90;
  string local_d70;
  string local_d50;
  string local_d30;
  string local_d10;
  string local_cf0;
  string local_cd0;
  string local_cb0;
  string local_c90;
  string local_c70;
  string local_c50;
  string local_c30;
  string local_c10;
  string local_bf0;
  string local_bd0;
  string local_bb0;
  string local_b90;
  string local_b70;
  string local_b50;
  string local_b30;
  string local_b10;
  string local_af0;
  string local_ad0;
  string local_ab0;
  string local_a90;
  string local_a70;
  string local_a50;
  string local_a30;
  string local_a10;
  string local_9f0;
  string local_9d0;
  string local_9b0;
  string local_990;
  string local_970;
  string local_950;
  string local_930;
  string local_910;
  string local_8f0;
  string local_8d0;
  string local_8b0;
  string local_890;
  string local_870;
  string local_850;
  string local_830;
  string local_810;
  string local_7f0;
  string local_7d0;
  string local_7b0;
  string local_790;
  string local_770;
  string local_750;
  string local_730;
  string local_710;
  string local_6f0;
  string local_6d0;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650;
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  bVar1 = AlignmentRecord::isPairedEnd(ap1);
  bVar2 = AlignmentRecord::isPairedEnd(ap2);
  if (bVar1 && bVar2) {
    uVar4 = AlignmentRecord::getEnd1(ap1);
    uVar5 = AlignmentRecord::getEnd2(ap1);
    uVar6 = AlignmentRecord::getStart1(ap1);
    uVar7 = AlignmentRecord::getStart2(ap1);
    uVar8 = AlignmentRecord::getEnd1(ap2);
    uVar9 = AlignmentRecord::getEnd2(ap2);
    uVar10 = AlignmentRecord::getStart1(ap2);
    uVar11 = AlignmentRecord::getStart2(ap2);
    if (uVar5 < uVar7 && uVar4 < uVar10) {
      AlignmentRecord::getName_abi_cxx11_(&local_df0,ap1);
      lVar12 = std::__cxx11::string::find((char *)&local_df0,0x1ae81e);
      if (lVar12 != -1) {
        AlignmentRecord::getName_abi_cxx11_(&local_dd0,ap2);
        std::__cxx11::string::find((char *)&local_dd0,0x1ae81e);
        std::__cxx11::string::~string((string *)&local_dd0);
      }
LAB_0017ba79:
      std::__cxx11::string::~string((string *)&local_df0);
      return false;
    }
    if (uVar9 < uVar7 && uVar8 < uVar6) {
      AlignmentRecord::getName_abi_cxx11_(&local_df0,ap1);
      lVar12 = std::__cxx11::string::find((char *)&local_df0,0x1ae81e);
      if (lVar12 != -1) {
        AlignmentRecord::getName_abi_cxx11_(&local_dd0,ap2);
        std::__cxx11::string::find((char *)&local_dd0,0x1ae81e);
        std::__cxx11::string::~string((string *)&local_dd0);
      }
      goto LAB_0017ba79;
    }
    if (uVar5 < uVar11 && uVar8 < uVar7) {
      AlignmentRecord::getName_abi_cxx11_(&local_df0,ap1);
      lVar12 = std::__cxx11::string::find((char *)&local_df0,0x1ae81e);
      if (lVar12 != -1) {
        AlignmentRecord::getName_abi_cxx11_(&local_dd0,ap2);
        std::__cxx11::string::find((char *)&local_dd0,0x1ae81e);
        std::__cxx11::string::~string((string *)&local_dd0);
      }
      goto LAB_0017ba79;
    }
    if (uVar4 < uVar11 && uVar9 < uVar7) {
      AlignmentRecord::getName_abi_cxx11_(&local_df0,ap1);
      lVar12 = std::__cxx11::string::find((char *)&local_df0,0x1ae81e);
      if (lVar12 != -1) {
        AlignmentRecord::getName_abi_cxx11_(&local_dd0,ap2);
        std::__cxx11::string::find((char *)&local_dd0,0x1ae81e);
        std::__cxx11::string::~string((string *)&local_dd0);
      }
      goto LAB_0017ba79;
    }
    if (uVar8 < uVar6 && uVar4 < uVar11) {
      AlignmentRecord::getName_abi_cxx11_(&local_df0,ap1);
      lVar12 = std::__cxx11::string::find((char *)&local_df0,0x1ae81e);
      if (lVar12 != -1) {
        AlignmentRecord::getName_abi_cxx11_(&local_dd0,ap2);
        std::__cxx11::string::find((char *)&local_dd0,0x1ae81e);
        std::__cxx11::string::~string((string *)&local_dd0);
      }
      goto LAB_0017ba79;
    }
    if (uVar4 < uVar10 && uVar8 < uVar7) {
      AlignmentRecord::getName_abi_cxx11_(&local_df0,ap1);
      lVar12 = std::__cxx11::string::find((char *)&local_df0,0x1ae81e);
      if (lVar12 != -1) {
        AlignmentRecord::getName_abi_cxx11_(&local_dd0,ap2);
        std::__cxx11::string::find((char *)&local_dd0,0x1ae81e);
        std::__cxx11::string::~string((string *)&local_dd0);
      }
      goto LAB_0017ba79;
    }
  }
  bVar3 = AlignmentRecord::isSingleEnd(ap1);
  if ((bVar3) && (bVar3 = AlignmentRecord::isSingleEnd(ap2), bVar3)) {
    AlignmentRecord::getCode1_abi_cxx11_(&local_1d0,ap1);
    AlignmentRecord::getGcQuality1_abi_cxx11_(&local_1f0,ap1);
    AlignmentRecord::getCode1_abi_cxx11_(&local_210,ap2);
    AlignmentRecord::getGcQuality1_abi_cxx11_(&local_230,ap2);
    uVar4 = AlignmentRecord::getStart1(ap1);
    uVar5 = AlignmentRecord::getEnd1(ap1);
    uVar6 = AlignmentRecord::getStart1(ap2);
    uVar7 = AlignmentRecord::getEnd1(ap2);
    bVar1 = AlignmentRecord::isStrand1(ap1);
    dVar15 = scoreSequences(this,&local_1d0,&local_1f0,&local_210,&local_230,uVar4,uVar5,uVar6,uVar7
                            ,bVar1,false,numGCAllowedPos,in_stack_fffffffffffff1c8);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_1d0);
    return (bool)(-(dVar15 == 1.0) & 1);
  }
  this_00 = ap1;
  bVar3 = AlignmentRecord::isSingleEnd(ap1);
  if ((!bVar2 || !bVar3) &&
     ((!bVar1 || (this_00 = ap2, bVar1 = AlignmentRecord::isSingleEnd(ap2), !bVar1)))) {
    uVar4 = pairedReadDetermination((NoMeEdgeCalculator *)this_00,ap1,ap2);
    switch(uVar4) {
    case 1:
      AlignmentRecord::getCode1_abi_cxx11_(&local_450,ap1);
      AlignmentRecord::getGcQuality1_abi_cxx11_(&local_470,ap1);
      AlignmentRecord::getCode1_abi_cxx11_(&local_490,ap2);
      AlignmentRecord::getGcQuality1_abi_cxx11_(&local_4b0,ap2);
      uVar4 = AlignmentRecord::getStart1(ap1);
      uVar5 = AlignmentRecord::getEnd1(ap1);
      uVar6 = AlignmentRecord::getStart1(ap2);
      uVar7 = AlignmentRecord::getEnd1(ap2);
      bVar1 = AlignmentRecord::isStrand1(ap1);
      local_e20 = scoreSequences(this,&local_450,&local_470,&local_490,&local_4b0,uVar4,uVar5,uVar6,
                                 uVar7,bVar1,false,numGCAllowedPos,in_stack_fffffffffffff1c8);
      std::__cxx11::string::~string((string *)&local_4b0);
      std::__cxx11::string::~string((string *)&local_490);
      std::__cxx11::string::~string((string *)&local_470);
      std::__cxx11::string::~string((string *)&local_450);
      if (local_e20 < 0.0) {
        return false;
      }
      AlignmentRecord::getCode2_abi_cxx11_(&local_4d0,ap1);
      AlignmentRecord::getGcQuality2_abi_cxx11_(&local_4f0,ap1);
      AlignmentRecord::getCode2_abi_cxx11_(&local_510,ap2);
      AlignmentRecord::getGcQuality2_abi_cxx11_(&local_530,ap2);
      uVar4 = AlignmentRecord::getStart2(ap1);
      uVar5 = AlignmentRecord::getEnd2(ap1);
      uVar6 = AlignmentRecord::getStart2(ap2);
      uVar7 = AlignmentRecord::getEnd2(ap2);
      bVar1 = AlignmentRecord::isStrand1(ap1);
      local_e28 = scoreSequences(this,&local_4d0,&local_4f0,&local_510,&local_530,uVar4,uVar5,uVar6,
                                 uVar7,bVar1,false,numGCAllowedPos,in_stack_fffffffffffff1c8);
      std::__cxx11::string::~string((string *)&local_530);
      std::__cxx11::string::~string((string *)&local_510);
      std::__cxx11::string::~string((string *)&local_4f0);
      psVar14 = &local_4d0;
      break;
    case 2:
    case 8:
      AlignmentRecord::getCode1_abi_cxx11_(&local_550,ap1);
      AlignmentRecord::getGcQuality1_abi_cxx11_(&local_570,ap1);
      AlignmentRecord::getCode1_abi_cxx11_(&local_590,ap2);
      AlignmentRecord::getGcQuality1_abi_cxx11_(&local_5b0,ap2);
      uVar4 = AlignmentRecord::getStart1(ap1);
      uVar5 = AlignmentRecord::getEnd1(ap1);
      uVar6 = AlignmentRecord::getStart1(ap2);
      uVar7 = AlignmentRecord::getEnd1(ap2);
      bVar1 = AlignmentRecord::isStrand1(ap1);
      local_e20 = scoreSequences(this,&local_550,&local_570,&local_590,&local_5b0,uVar4,uVar5,uVar6,
                                 uVar7,bVar1,false,numGCAllowedPos,in_stack_fffffffffffff1c8);
      std::__cxx11::string::~string((string *)&local_5b0);
      std::__cxx11::string::~string((string *)&local_590);
      std::__cxx11::string::~string((string *)&local_570);
      std::__cxx11::string::~string((string *)&local_550);
      if (local_e20 < 0.0) {
        return false;
      }
      AlignmentRecord::getCode2_abi_cxx11_(&local_5d0,ap1);
      AlignmentRecord::getGcQuality2_abi_cxx11_(&local_5f0,ap1);
      AlignmentRecord::getCode1_abi_cxx11_(&local_610,ap2);
      AlignmentRecord::getGcQuality1_abi_cxx11_(&local_630,ap2);
      uVar4 = AlignmentRecord::getStart2(ap1);
      uVar5 = AlignmentRecord::getEnd2(ap1);
      uVar6 = AlignmentRecord::getStart1(ap2);
      uVar7 = AlignmentRecord::getEnd1(ap2);
      bVar1 = AlignmentRecord::isStrand1(ap1);
      local_e08 = (string *)
                  scoreSequences(this,&local_5d0,&local_5f0,&local_610,&local_630,uVar4,uVar5,uVar6,
                                 uVar7,bVar1,false,numGCAllowedPos,in_stack_fffffffffffff1c8);
      std::__cxx11::string::~string((string *)&local_630);
      std::__cxx11::string::~string((string *)&local_610);
      std::__cxx11::string::~string((string *)&local_5f0);
      std::__cxx11::string::~string((string *)&local_5d0);
      if ((double)local_e08 < 0.0) {
        return false;
      }
      AlignmentRecord::getCode2_abi_cxx11_(&local_650,ap1);
      AlignmentRecord::getGcQuality2_abi_cxx11_(&local_670,ap1);
      AlignmentRecord::getCode2_abi_cxx11_(&local_690,ap2);
      AlignmentRecord::getGcQuality2_abi_cxx11_(&local_6b0,ap2);
      uVar4 = AlignmentRecord::getStart2(ap1);
      uVar5 = AlignmentRecord::getEnd2(ap1);
      uVar6 = AlignmentRecord::getStart2(ap2);
      uVar7 = AlignmentRecord::getEnd2(ap2);
      bVar1 = AlignmentRecord::isStrand1(ap1);
      local_e28 = scoreSequences(this,&local_650,&local_670,&local_690,&local_6b0,uVar4,uVar5,uVar6,
                                 uVar7,bVar1,false,numGCAllowedPos,in_stack_fffffffffffff1c8);
      std::__cxx11::string::~string((string *)&local_6b0);
      std::__cxx11::string::~string((string *)&local_690);
      std::__cxx11::string::~string((string *)&local_670);
      psVar14 = &local_650;
      goto LAB_0017c060;
    case 3:
    case 9:
      AlignmentRecord::getCode1_abi_cxx11_(&local_6d0,ap1);
      AlignmentRecord::getGcQuality1_abi_cxx11_(&local_6f0,ap1);
      AlignmentRecord::getCode1_abi_cxx11_(&local_710,ap2);
      AlignmentRecord::getGcQuality1_abi_cxx11_(&local_730,ap2);
      uVar4 = AlignmentRecord::getStart1(ap1);
      uVar5 = AlignmentRecord::getEnd1(ap1);
      uVar6 = AlignmentRecord::getStart1(ap2);
      uVar7 = AlignmentRecord::getEnd1(ap2);
      bVar1 = AlignmentRecord::isStrand1(ap1);
      local_e20 = scoreSequences(this,&local_6d0,&local_6f0,&local_710,&local_730,uVar4,uVar5,uVar6,
                                 uVar7,bVar1,false,numGCAllowedPos,in_stack_fffffffffffff1c8);
      std::__cxx11::string::~string((string *)&local_730);
      std::__cxx11::string::~string((string *)&local_710);
      std::__cxx11::string::~string((string *)&local_6f0);
      std::__cxx11::string::~string((string *)&local_6d0);
      if (local_e20 < 0.0) {
        return false;
      }
      AlignmentRecord::getCode2_abi_cxx11_(&local_750,ap1);
      AlignmentRecord::getGcQuality2_abi_cxx11_(&local_770,ap1);
      AlignmentRecord::getCode1_abi_cxx11_(&local_790,ap2);
      AlignmentRecord::getGcQuality1_abi_cxx11_(&local_7b0,ap2);
      uVar4 = AlignmentRecord::getStart2(ap1);
      uVar5 = AlignmentRecord::getEnd2(ap1);
      uVar6 = AlignmentRecord::getStart1(ap2);
      uVar7 = AlignmentRecord::getEnd1(ap2);
      bVar1 = AlignmentRecord::isStrand1(ap1);
      local_e28 = scoreSequences(this,&local_750,&local_770,&local_790,&local_7b0,uVar4,uVar5,uVar6,
                                 uVar7,bVar1,false,numGCAllowedPos,in_stack_fffffffffffff1c8);
      std::__cxx11::string::~string((string *)&local_7b0);
      std::__cxx11::string::~string((string *)&local_790);
      std::__cxx11::string::~string((string *)&local_770);
      psVar14 = &local_750;
      break;
    default:
      if ((uVar4 & 0xe) == 4) {
        AlignmentRecord::getCode2_abi_cxx11_(&local_7d0,ap1);
        AlignmentRecord::getGcQuality2_abi_cxx11_(&local_7f0,ap1);
        AlignmentRecord::getCode1_abi_cxx11_(&local_810,ap2);
        AlignmentRecord::getGcQuality1_abi_cxx11_(&local_830,ap2);
        uVar4 = AlignmentRecord::getStart2(ap1);
        uVar5 = AlignmentRecord::getEnd2(ap1);
        uVar6 = AlignmentRecord::getStart1(ap2);
        uVar7 = AlignmentRecord::getEnd1(ap2);
        bVar1 = AlignmentRecord::isStrand1(ap1);
        local_e20 = scoreSequences(this,&local_7d0,&local_7f0,&local_810,&local_830,uVar4,uVar5,
                                   uVar6,uVar7,bVar1,false,numGCAllowedPos,in_stack_fffffffffffff1c8
                                  );
        std::__cxx11::string::~string((string *)&local_830);
        std::__cxx11::string::~string((string *)&local_810);
        std::__cxx11::string::~string((string *)&local_7f0);
        std::__cxx11::string::~string((string *)&local_7d0);
        if (local_e20 < 0.0) {
          return false;
        }
        AlignmentRecord::getCode2_abi_cxx11_(&local_850,ap1);
        AlignmentRecord::getGcQuality2_abi_cxx11_(&local_870,ap1);
        AlignmentRecord::getCode2_abi_cxx11_(&local_890,ap2);
        AlignmentRecord::getGcQuality2_abi_cxx11_(&local_8b0,ap2);
        uVar4 = AlignmentRecord::getStart2(ap1);
        uVar5 = AlignmentRecord::getEnd2(ap1);
        uVar6 = AlignmentRecord::getStart2(ap2);
        uVar7 = AlignmentRecord::getEnd2(ap2);
        bVar1 = AlignmentRecord::isStrand1(ap1);
        local_e28 = scoreSequences(this,&local_850,&local_870,&local_890,&local_8b0,uVar4,uVar5,
                                   uVar6,uVar7,bVar1,false,numGCAllowedPos,in_stack_fffffffffffff1c8
                                  );
        std::__cxx11::string::~string((string *)&local_8b0);
        std::__cxx11::string::~string((string *)&local_890);
        std::__cxx11::string::~string((string *)&local_870);
        psVar14 = &local_850;
        break;
      }
      if ((uVar4 == 0xd) || (uVar4 == 7)) {
        AlignmentRecord::getCode1_abi_cxx11_(&local_a50,ap1);
        AlignmentRecord::getGcQuality1_abi_cxx11_(&local_a70,ap1);
        AlignmentRecord::getCode1_abi_cxx11_(&local_a90,ap2);
        AlignmentRecord::getGcQuality1_abi_cxx11_(&local_ab0,ap2);
        uVar4 = AlignmentRecord::getStart1(ap1);
        uVar5 = AlignmentRecord::getEnd1(ap1);
        uVar6 = AlignmentRecord::getStart1(ap2);
        uVar7 = AlignmentRecord::getEnd1(ap2);
        bVar1 = AlignmentRecord::isStrand1(ap1);
        local_e20 = scoreSequences(this,&local_a50,&local_a70,&local_a90,&local_ab0,uVar4,uVar5,
                                   uVar6,uVar7,bVar1,false,numGCAllowedPos,in_stack_fffffffffffff1c8
                                  );
        std::__cxx11::string::~string((string *)&local_ab0);
        std::__cxx11::string::~string((string *)&local_a90);
        std::__cxx11::string::~string((string *)&local_a70);
        std::__cxx11::string::~string((string *)&local_a50);
        if (local_e20 < 0.0) {
          return false;
        }
        AlignmentRecord::getCode1_abi_cxx11_(&local_ad0,ap1);
        AlignmentRecord::getGcQuality1_abi_cxx11_(&local_af0,ap1);
        AlignmentRecord::getCode2_abi_cxx11_(&local_b10,ap2);
        AlignmentRecord::getGcQuality2_abi_cxx11_(&local_b30,ap2);
        uVar4 = AlignmentRecord::getStart1(ap1);
        uVar5 = AlignmentRecord::getEnd1(ap1);
        uVar6 = AlignmentRecord::getStart2(ap2);
        uVar7 = AlignmentRecord::getEnd2(ap2);
        bVar1 = AlignmentRecord::isStrand1(ap1);
        local_e28 = scoreSequences(this,&local_ad0,&local_af0,&local_b10,&local_b30,uVar4,uVar5,
                                   uVar6,uVar7,bVar1,false,numGCAllowedPos,in_stack_fffffffffffff1c8
                                  );
        std::__cxx11::string::~string((string *)&local_b30);
        std::__cxx11::string::~string((string *)&local_b10);
        std::__cxx11::string::~string((string *)&local_af0);
        psVar14 = &local_ad0;
        break;
      }
      if (uVar4 == 6) {
        AlignmentRecord::getCode1_abi_cxx11_(&local_8d0,ap1);
        AlignmentRecord::getGcQuality1_abi_cxx11_(&local_8f0,ap1);
        AlignmentRecord::getCode1_abi_cxx11_(&local_910,ap2);
        AlignmentRecord::getGcQuality1_abi_cxx11_(&local_930,ap2);
        uVar4 = AlignmentRecord::getStart1(ap1);
        uVar5 = AlignmentRecord::getEnd1(ap1);
        uVar6 = AlignmentRecord::getStart1(ap2);
        uVar7 = AlignmentRecord::getEnd1(ap2);
        bVar1 = AlignmentRecord::isStrand1(ap1);
        local_e20 = scoreSequences(this,&local_8d0,&local_8f0,&local_910,&local_930,uVar4,uVar5,
                                   uVar6,uVar7,bVar1,false,numGCAllowedPos,in_stack_fffffffffffff1c8
                                  );
        std::__cxx11::string::~string((string *)&local_930);
        std::__cxx11::string::~string((string *)&local_910);
        std::__cxx11::string::~string((string *)&local_8f0);
        std::__cxx11::string::~string((string *)&local_8d0);
        if (local_e20 < 0.0) {
          return false;
        }
        AlignmentRecord::getCode1_abi_cxx11_(&local_950,ap1);
        AlignmentRecord::getGcQuality1_abi_cxx11_(&local_970,ap1);
        AlignmentRecord::getCode2_abi_cxx11_(&local_990,ap2);
        AlignmentRecord::getGcQuality2_abi_cxx11_(&local_9b0,ap2);
        uVar4 = AlignmentRecord::getStart1(ap1);
        uVar5 = AlignmentRecord::getEnd1(ap1);
        uVar6 = AlignmentRecord::getStart2(ap2);
        uVar7 = AlignmentRecord::getEnd2(ap2);
        bVar1 = AlignmentRecord::isStrand1(ap1);
        local_e08 = (string *)
                    scoreSequences(this,&local_950,&local_970,&local_990,&local_9b0,uVar4,uVar5,
                                   uVar6,uVar7,bVar1,false,numGCAllowedPos,in_stack_fffffffffffff1c8
                                  );
        std::__cxx11::string::~string((string *)&local_9b0);
        std::__cxx11::string::~string((string *)&local_990);
        std::__cxx11::string::~string((string *)&local_970);
        std::__cxx11::string::~string((string *)&local_950);
        if ((double)local_e08 < 0.0) {
          return false;
        }
        AlignmentRecord::getCode2_abi_cxx11_(&local_9d0,ap1);
        AlignmentRecord::getGcQuality2_abi_cxx11_(&local_9f0,ap1);
        AlignmentRecord::getCode2_abi_cxx11_(&local_a10,ap2);
        AlignmentRecord::getGcQuality2_abi_cxx11_(&local_a30,ap2);
        uVar4 = AlignmentRecord::getStart2(ap1);
        uVar5 = AlignmentRecord::getEnd2(ap1);
        uVar6 = AlignmentRecord::getStart2(ap2);
        uVar7 = AlignmentRecord::getEnd2(ap2);
        bVar1 = AlignmentRecord::isStrand1(ap1);
        local_e28 = scoreSequences(this,&local_9d0,&local_9f0,&local_a10,&local_a30,uVar4,uVar5,
                                   uVar6,uVar7,bVar1,false,numGCAllowedPos,in_stack_fffffffffffff1c8
                                  );
        std::__cxx11::string::~string((string *)&local_a30);
        std::__cxx11::string::~string((string *)&local_a10);
        std::__cxx11::string::~string((string *)&local_9f0);
        psVar14 = &local_9d0;
      }
      else {
        if ((uVar4 & 0xe) == 10) {
          AlignmentRecord::getCode1_abi_cxx11_(&local_b50,ap1);
          AlignmentRecord::getGcQuality1_abi_cxx11_(&local_b70,ap1);
          AlignmentRecord::getCode2_abi_cxx11_(&local_b90,ap2);
          AlignmentRecord::getGcQuality2_abi_cxx11_(&local_bb0,ap2);
          uVar4 = AlignmentRecord::getStart1(ap1);
          uVar5 = AlignmentRecord::getEnd1(ap1);
          uVar6 = AlignmentRecord::getStart2(ap2);
          uVar7 = AlignmentRecord::getEnd2(ap2);
          bVar1 = AlignmentRecord::isStrand1(ap1);
          local_e20 = scoreSequences(this,&local_b50,&local_b70,&local_b90,&local_bb0,uVar4,uVar5,
                                     uVar6,uVar7,bVar1,false,numGCAllowedPos,
                                     in_stack_fffffffffffff1c8);
          std::__cxx11::string::~string((string *)&local_bb0);
          std::__cxx11::string::~string((string *)&local_b90);
          std::__cxx11::string::~string((string *)&local_b70);
          std::__cxx11::string::~string((string *)&local_b50);
          if (local_e20 < 0.0) {
            return false;
          }
          AlignmentRecord::getCode2_abi_cxx11_(&local_bd0,ap1);
          AlignmentRecord::getGcQuality2_abi_cxx11_(&local_bf0,ap1);
          AlignmentRecord::getCode2_abi_cxx11_(&local_c10,ap2);
          AlignmentRecord::getGcQuality2_abi_cxx11_(&local_c30,ap2);
          uVar4 = AlignmentRecord::getStart2(ap1);
          uVar5 = AlignmentRecord::getEnd2(ap1);
          uVar6 = AlignmentRecord::getStart2(ap2);
          uVar7 = AlignmentRecord::getEnd2(ap2);
          bVar1 = AlignmentRecord::isStrand1(ap1);
          local_e28 = scoreSequences(this,&local_bd0,&local_bf0,&local_c10,&local_c30,uVar4,uVar5,
                                     uVar6,uVar7,bVar1,false,numGCAllowedPos,
                                     in_stack_fffffffffffff1c8);
          std::__cxx11::string::~string((string *)&local_c30);
          std::__cxx11::string::~string((string *)&local_c10);
          std::__cxx11::string::~string((string *)&local_bf0);
          psVar14 = &local_bd0;
          break;
        }
        local_e28 = 0.0;
        if (uVar4 != 0xc) goto LAB_0017d23e;
        AlignmentRecord::getCode1_abi_cxx11_(&local_c50,ap1);
        AlignmentRecord::getGcQuality1_abi_cxx11_(&local_c70,ap1);
        AlignmentRecord::getCode1_abi_cxx11_(&local_c90,ap2);
        AlignmentRecord::getGcQuality1_abi_cxx11_(&local_cb0,ap2);
        uVar4 = AlignmentRecord::getStart1(ap1);
        uVar5 = AlignmentRecord::getEnd1(ap1);
        uVar6 = AlignmentRecord::getStart1(ap2);
        uVar7 = AlignmentRecord::getEnd1(ap2);
        bVar1 = AlignmentRecord::isStrand1(ap1);
        local_e20 = scoreSequences(this,&local_c50,&local_c70,&local_c90,&local_cb0,uVar4,uVar5,
                                   uVar6,uVar7,bVar1,false,numGCAllowedPos,in_stack_fffffffffffff1c8
                                  );
        std::__cxx11::string::~string((string *)&local_cb0);
        std::__cxx11::string::~string((string *)&local_c90);
        std::__cxx11::string::~string((string *)&local_c70);
        std::__cxx11::string::~string((string *)&local_c50);
        if (local_e20 < 0.0) {
          return false;
        }
        AlignmentRecord::getCode1_abi_cxx11_(&local_cd0,ap1);
        AlignmentRecord::getGcQuality1_abi_cxx11_(&local_cf0,ap1);
        AlignmentRecord::getCode2_abi_cxx11_(&local_d10,ap2);
        AlignmentRecord::getGcQuality2_abi_cxx11_(&local_d30,ap2);
        uVar4 = AlignmentRecord::getStart1(ap1);
        uVar5 = AlignmentRecord::getEnd1(ap1);
        uVar6 = AlignmentRecord::getStart2(ap2);
        uVar7 = AlignmentRecord::getEnd2(ap2);
        bVar1 = AlignmentRecord::isStrand1(ap1);
        local_e08 = (string *)
                    scoreSequences(this,&local_cd0,&local_cf0,&local_d10,&local_d30,uVar4,uVar5,
                                   uVar6,uVar7,bVar1,false,numGCAllowedPos,in_stack_fffffffffffff1c8
                                  );
        std::__cxx11::string::~string((string *)&local_d30);
        std::__cxx11::string::~string((string *)&local_d10);
        std::__cxx11::string::~string((string *)&local_cf0);
        std::__cxx11::string::~string((string *)&local_cd0);
        if ((double)local_e08 < 0.0) {
          return false;
        }
        AlignmentRecord::getCode2_abi_cxx11_(&local_d50,ap1);
        AlignmentRecord::getGcQuality2_abi_cxx11_(&local_d70,ap1);
        AlignmentRecord::getCode2_abi_cxx11_(&local_d90,ap2);
        AlignmentRecord::getGcQuality2_abi_cxx11_(&local_db0,ap2);
        uVar4 = AlignmentRecord::getStart2(ap1);
        uVar5 = AlignmentRecord::getEnd2(ap1);
        uVar6 = AlignmentRecord::getStart2(ap2);
        uVar7 = AlignmentRecord::getEnd2(ap2);
        bVar1 = AlignmentRecord::isStrand1(ap1);
        local_e28 = scoreSequences(this,&local_d50,&local_d70,&local_d90,&local_db0,uVar4,uVar5,
                                   uVar6,uVar7,bVar1,false,numGCAllowedPos,in_stack_fffffffffffff1c8
                                  );
        std::__cxx11::string::~string((string *)&local_db0);
        std::__cxx11::string::~string((string *)&local_d90);
        std::__cxx11::string::~string((string *)&local_d70);
        psVar14 = &local_d50;
      }
LAB_0017c060:
      std::__cxx11::string::~string((string *)psVar14);
      if (local_e28 < 0.0) {
        return false;
      }
      local_e20 = local_e20 + 0.0 + (double)local_e08;
      goto LAB_0017d232;
    }
    std::__cxx11::string::~string((string *)psVar14);
    if (local_e28 < 0.0) {
      return false;
    }
    local_e20 = local_e20 + 0.0;
LAB_0017d232:
    local_e28 = local_e20 + local_e28;
    goto LAB_0017d23e;
  }
  pVar13 = mixedReadDetermination((NoMeEdgeCalculator *)this_00,ap1,ap2);
  if ((ulong)pVar13 >> 0x20 == 0 || pVar13.first == 0) {
    return false;
  }
  if (pVar13.first != 1) {
    local_e28 = 0.0;
    local_e20 = 0.0;
    if (pVar13.second == 1) {
      local_e08 = &local_170;
      AlignmentRecord::getCode2_abi_cxx11_(local_e08,ap1);
      local_df8 = &local_190;
      AlignmentRecord::getGcQuality2_abi_cxx11_(local_df8,ap1);
      local_e00 = &local_1b0;
      AlignmentRecord::getCode1_abi_cxx11_(local_e00,ap2);
      psVar14 = &local_90;
      AlignmentRecord::getGcQuality1_abi_cxx11_(psVar14,ap2);
      uVar4 = AlignmentRecord::getStart2(ap1);
      uVar5 = AlignmentRecord::getEnd2(ap1);
      uVar6 = AlignmentRecord::getStart1(ap2);
      uVar7 = AlignmentRecord::getEnd1(ap2);
      bVar1 = AlignmentRecord::isStrand1(ap1);
      local_e28 = scoreSequences(this,&local_170,&local_190,&local_1b0,psVar14,uVar4,uVar5,uVar6,
                                 uVar7,bVar1,false,numGCAllowedPos,in_stack_fffffffffffff1c8);
      goto LAB_0017cc8c;
    }
    goto LAB_0017cccc;
  }
  switch(pVar13.second) {
  case 1:
    local_e08 = &local_b0;
    AlignmentRecord::getCode1_abi_cxx11_(local_e08,ap1);
    local_df8 = &local_d0;
    AlignmentRecord::getGcQuality1_abi_cxx11_(local_df8,ap1);
    local_e00 = &local_f0;
    AlignmentRecord::getCode1_abi_cxx11_(local_e00,ap2);
    psVar14 = &local_50;
    AlignmentRecord::getGcQuality1_abi_cxx11_(psVar14,ap2);
    uVar4 = AlignmentRecord::getStart1(ap1);
    uVar5 = AlignmentRecord::getEnd1(ap1);
    uVar6 = AlignmentRecord::getStart1(ap2);
    uVar7 = AlignmentRecord::getEnd1(ap2);
    bVar1 = AlignmentRecord::isStrand1(ap1);
    local_e20 = scoreSequences(this,&local_b0,&local_d0,&local_f0,psVar14,uVar4,uVar5,uVar6,uVar7,
                               bVar1,false,numGCAllowedPos,in_stack_fffffffffffff1c8);
    local_e28 = 0.0;
    break;
  case 2:
    local_e08 = &local_110;
    AlignmentRecord::getCode1_abi_cxx11_(local_e08,ap1);
    local_df8 = &local_130;
    AlignmentRecord::getGcQuality1_abi_cxx11_(local_df8,ap1);
    local_e00 = &local_150;
    AlignmentRecord::getCode2_abi_cxx11_(local_e00,ap2);
    psVar14 = &local_70;
    AlignmentRecord::getGcQuality2_abi_cxx11_(psVar14,ap2);
    uVar4 = AlignmentRecord::getStart1(ap1);
    uVar5 = AlignmentRecord::getEnd1(ap1);
    uVar6 = AlignmentRecord::getStart2(ap2);
    uVar7 = AlignmentRecord::getEnd2(ap2);
    bVar1 = AlignmentRecord::isStrand1(ap1);
    local_e28 = scoreSequences(this,&local_110,&local_130,&local_150,psVar14,uVar4,uVar5,uVar6,uVar7
                               ,bVar1,false,numGCAllowedPos,in_stack_fffffffffffff1c8);
LAB_0017cc8c:
    local_e20 = 0.0;
    break;
  case 3:
    AlignmentRecord::getCode1_abi_cxx11_(&local_250,ap1);
    AlignmentRecord::getGcQuality1_abi_cxx11_(&local_270,ap1);
    AlignmentRecord::getCode1_abi_cxx11_(&local_290,ap2);
    AlignmentRecord::getGcQuality1_abi_cxx11_(&local_2b0,ap2);
    uVar4 = AlignmentRecord::getStart1(ap1);
    uVar5 = AlignmentRecord::getEnd1(ap1);
    uVar6 = AlignmentRecord::getStart1(ap2);
    uVar7 = AlignmentRecord::getEnd1(ap2);
    bVar1 = AlignmentRecord::isStrand1(ap1);
    local_e20 = scoreSequences(this,&local_250,&local_270,&local_290,&local_2b0,uVar4,uVar5,uVar6,
                               uVar7,bVar1,false,numGCAllowedPos,in_stack_fffffffffffff1c8);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_250);
    if ((local_e20 == -1.0) && (!NAN(local_e20))) {
      return false;
    }
    AlignmentRecord::getCode1_abi_cxx11_(&local_2d0,ap1);
    AlignmentRecord::getGcQuality1_abi_cxx11_(&local_2f0,ap1);
    AlignmentRecord::getCode2_abi_cxx11_(&local_310,ap2);
    AlignmentRecord::getGcQuality2_abi_cxx11_(&local_330,ap2);
    uVar4 = AlignmentRecord::getStart1(ap1);
    uVar5 = AlignmentRecord::getEnd1(ap1);
    uVar6 = AlignmentRecord::getStart2(ap2);
    uVar7 = AlignmentRecord::getEnd2(ap2);
    bVar1 = AlignmentRecord::isStrand1(ap1);
    local_e28 = scoreSequences(this,&local_2d0,&local_2f0,&local_310,&local_330,uVar4,uVar5,uVar6,
                               uVar7,bVar1,false,numGCAllowedPos,in_stack_fffffffffffff1c8);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_2f0);
    psVar14 = &local_2d0;
    goto LAB_0017cb92;
  case 4:
    AlignmentRecord::getCode1_abi_cxx11_(&local_350,ap1);
    AlignmentRecord::getGcQuality1_abi_cxx11_(&local_370,ap1);
    AlignmentRecord::getCode1_abi_cxx11_(&local_390,ap2);
    AlignmentRecord::getGcQuality1_abi_cxx11_(&local_3b0,ap2);
    uVar4 = AlignmentRecord::getStart1(ap1);
    uVar5 = AlignmentRecord::getEnd1(ap1);
    uVar6 = AlignmentRecord::getStart1(ap2);
    uVar7 = AlignmentRecord::getEnd1(ap2);
    bVar1 = AlignmentRecord::isStrand1(ap1);
    local_e20 = scoreSequences(this,&local_350,&local_370,&local_390,&local_3b0,uVar4,uVar5,uVar6,
                               uVar7,bVar1,false,numGCAllowedPos,in_stack_fffffffffffff1c8);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_350);
    if ((local_e20 == -1.0) && (!NAN(local_e20))) {
      return false;
    }
    AlignmentRecord::getCode2_abi_cxx11_(&local_3d0,ap1);
    AlignmentRecord::getGcQuality2_abi_cxx11_(&local_3f0,ap1);
    AlignmentRecord::getCode1_abi_cxx11_(&local_410,ap2);
    AlignmentRecord::getGcQuality1_abi_cxx11_(&local_430,ap2);
    uVar4 = AlignmentRecord::getStart2(ap1);
    uVar5 = AlignmentRecord::getEnd2(ap1);
    uVar6 = AlignmentRecord::getStart1(ap2);
    uVar7 = AlignmentRecord::getEnd1(ap2);
    bVar1 = AlignmentRecord::isStrand1(ap1);
    local_e28 = scoreSequences(this,&local_3d0,&local_3f0,&local_410,&local_430,uVar4,uVar5,uVar6,
                               uVar7,bVar1,false,numGCAllowedPos,in_stack_fffffffffffff1c8);
    std::__cxx11::string::~string((string *)&local_430);
    std::__cxx11::string::~string((string *)&local_410);
    std::__cxx11::string::~string((string *)&local_3f0);
    psVar14 = &local_3d0;
LAB_0017cb92:
    std::__cxx11::string::~string((string *)psVar14);
    if ((local_e28 == -1.0) && (!NAN(local_e28))) {
      return false;
    }
    goto LAB_0017cccc;
  default:
    local_e28 = 0.0;
    local_e20 = 0.0;
    goto LAB_0017cccc;
  }
  std::__cxx11::string::~string((string *)psVar14);
  std::__cxx11::string::~string((string *)local_e00);
  std::__cxx11::string::~string((string *)local_df8);
  std::__cxx11::string::~string((string *)local_e08);
LAB_0017cccc:
  local_e28 = local_e28 + local_e20;
LAB_0017d23e:
  return 2.0 <= local_e28;
}

Assistant:

bool NoMeEdgeCalculator::scoreReads(const AlignmentRecord& ap1, const AlignmentRecord& ap2, bool isClique,int numGCAllowedPos, int ct) const{

    double score =0;

    double scorePair1 = 0;
    double scorePair2 = 0;


    bool pe1 = ap1.isPairedEnd();
    bool pe2 = ap2.isPairedEnd();

    // special cases of paired end reads for which no edge is allowed
    if(pe1 && pe2){

        unsigned int e11= ap1.getEnd1();
        unsigned int e12= ap1.getEnd2();
        unsigned int s11= ap1.getStart1();
        unsigned int s12= ap1.getStart2();
        unsigned int e21= ap2.getEnd1();
        unsigned int e22= ap2.getEnd2();
        unsigned int s21= ap2.getStart1();
        unsigned int s22= ap2.getStart2();
        //--------   ---------
        //           ---------   -------
        if(e11 < s21 && e12 < s12){
            if((ap1.getName().find("Clique") != string::npos)&&(ap2.getName().find("Clique") != string::npos)){
            }

            return false;
        } //         ---------    ---------
        //-------    ---------
        else if(e21 < s11 && e22 < s12){
            if((ap1.getName().find("Clique") != string::npos)&&(ap2.getName().find("Clique") != string::npos)){
            }
            return false;
        } // ------------     ----------
        //   -----------                  ---------
        else if(e21 < s12 && e12 < s22){
            if((ap1.getName().find("Clique") != string::npos)&&(ap2.getName().find("Clique") != string::npos)){
            }
            return false;
        }//-----------            ----------
        //-----------  ----------
        else if(e11 < s22 && e22 < s12){
            if((ap1.getName().find("Clique") != string::npos)&&(ap2.getName().find("Clique") != string::npos)){
            }
            return false;
        }//          --------- ---------
        //----------           ---------
        else if (e21 < s11 && e11 < s22){
            if((ap1.getName().find("Clique") != string::npos)&&(ap2.getName().find("Clique") != string::npos)){
            }
            return false;
        }//--------             --------
        //           --------   --------
        else if(e11 < s21 && e21 < s12){
            if((ap1.getName().find("Clique") != string::npos)&&(ap2.getName().find("Clique") != string::npos)){
            }
            return false;
        }
    }


    //Scoring for single ended cliques
     if(ap1.isSingleEnd() && ap2.isSingleEnd() ){
         score = scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode1(),ap2.getGcQuality1(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart1(),ap2.getEnd1() , ap1.isStrand1(),isClique,numGCAllowedPos, ct);
         if(score==1)return true;
         else return false;

     }



    //For mixed single and paired end cliques
    if((ap1.isSingleEnd() && pe2)||(pe1 && ap2.isSingleEnd())){
        std::pair<int , int> result =mixedReadDetermination(ap1,ap2);
        int first = result.first;
        int second = result.second;
        if(first==0||second==0){
            return false;
        }
        if(first==1){
            if(second==1){
                scorePair1 = scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode1(),ap2.getGcQuality1(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart1(),ap2.getEnd1() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
                scorePair2 = 0;
            }else if(second == 2){
                scorePair2 = scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode2(),ap2.getGcQuality2(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart2(),ap2.getEnd2() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
                scorePair1 = 0;
            }else if(second == 3){
                scorePair1 = scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode1(),ap2.getGcQuality1(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart1(),ap2.getEnd1() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
                if(scorePair1 == -1) return false;
                //For the second Mate
                scorePair2 = scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode2(),ap2.getGcQuality2(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart2(),ap2.getEnd2() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
                if(scorePair2 == -1) return false;
            }else if(second == 4){
                scorePair1 = scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode1(),ap2.getGcQuality1(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart1(),ap2.getEnd1() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
                if(scorePair1 == -1) return false;
                //For the second Mate
                scorePair2=scoreSequences(ap1.getCode2(),ap1.getGcQuality2(),ap2.getCode1(),ap2.getGcQuality1(),ap1.getStart2(),ap1.getEnd2(),ap2.getStart1(),ap2.getEnd1() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
                if(scorePair2 == -1) return false;
            }
        }else{
            if(second == 1){
                scorePair2 = scoreSequences(ap1.getCode2(),ap1.getGcQuality2(),ap2.getCode1(),ap2.getGcQuality1(),ap1.getStart2(),ap1.getEnd2(),ap2.getStart1(),ap2.getEnd1() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
                scorePair1 = 0;
            }
        }

        if(scorePair1+scorePair2>=2)return true;
        else return false;


    }



     double tempScore = 0;
    //Scoring sequences for paired end cliques
    if(pe1&&pe2){
        int returnVal = pairedReadDetermination(ap1,ap2);
        if(returnVal == 1 ){
          tempScore = scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode1(),ap2.getGcQuality1(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart1(),ap2.getEnd1() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
          if (tempScore < 0) return false;
          score += tempScore;
          tempScore = scoreSequences(ap1.getCode2(),ap1.getGcQuality2(),ap2.getCode2(),ap2.getGcQuality2(),ap1.getStart2(),ap1.getEnd2(),ap2.getStart2(),ap2.getEnd2() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
          if (tempScore < 0) return false;
          score += tempScore;
        }else if(returnVal == 2 || returnVal == 8){
            tempScore = scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode1(),ap2.getGcQuality1(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart1(),ap2.getEnd1() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
            tempScore = scoreSequences(ap1.getCode2(),ap1.getGcQuality2(),ap2.getCode1(),ap2.getGcQuality1(),ap1.getStart2(),ap1.getEnd2(),ap2.getStart1(),ap2.getEnd1() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
            tempScore=scoreSequences(ap1.getCode2(),ap1.getGcQuality2(),ap2.getCode2(),ap2.getGcQuality2(),ap1.getStart2(),ap1.getEnd2(),ap2.getStart2(),ap2.getEnd2() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
        }else if(returnVal == 3 || returnVal == 9){
            tempScore = scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode1(),ap2.getGcQuality1(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart1(),ap2.getEnd1() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
            tempScore = scoreSequences(ap1.getCode2(),ap1.getGcQuality2(),ap2.getCode1(),ap2.getGcQuality1(),ap1.getStart2(),ap1.getEnd2(),ap2.getStart1(),ap2.getEnd1() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
        }else if(returnVal == 4 || returnVal == 5){
            tempScore = scoreSequences(ap1.getCode2(),ap1.getGcQuality2(),ap2.getCode1(),ap2.getGcQuality1(),ap1.getStart2(),ap1.getEnd2(),ap2.getStart1(),ap2.getEnd1() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
            tempScore=scoreSequences(ap1.getCode2(),ap1.getGcQuality2(),ap2.getCode2(),ap2.getGcQuality2(),ap1.getStart2(),ap1.getEnd2(),ap2.getStart2(),ap2.getEnd2() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
        }else if(returnVal == 6){
            tempScore = scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode1(),ap2.getGcQuality1(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart1(),ap2.getEnd1() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
            tempScore = scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode2(),ap2.getGcQuality2(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart2(),ap2.getEnd2() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
            tempScore=scoreSequences(ap1.getCode2(),ap1.getGcQuality2(),ap2.getCode2(),ap2.getGcQuality2(),ap1.getStart2(),ap1.getEnd2(),ap2.getStart2(),ap2.getEnd2() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
        }else if(returnVal == 7 || returnVal == 13){
            tempScore = scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode1(),ap2.getGcQuality1(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart1(),ap2.getEnd1() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
            //For the second Mate
            tempScore=scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode2(),ap2.getGcQuality2(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart2(),ap2.getEnd2() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
        }else if(returnVal == 10 || returnVal == 11){
            tempScore = scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode2(),ap2.getGcQuality2(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart2(),ap2.getEnd2() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
            //For the second Mate
            tempScore = scoreSequences(ap1.getCode2(),ap1.getGcQuality2(),ap2.getCode2(),ap2.getGcQuality2(),ap1.getStart2(),ap1.getEnd2(),ap2.getStart2(),ap2.getEnd2() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
        }else if(returnVal == 12){
            tempScore = scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode1(),ap2.getGcQuality1(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart1(),ap2.getEnd1() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
            tempScore = scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode2(),ap2.getGcQuality2(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart2(),ap2.getEnd2() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
            tempScore=scoreSequences(ap1.getCode2(),ap1.getGcQuality2(),ap2.getCode2(),ap2.getGcQuality2(),ap1.getStart2(),ap1.getEnd2(),ap2.getStart2(),ap2.getEnd2() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
        }

        if(score>=2)return true;
        else return false;
    }



}